

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

uint64_t __thiscall google::protobuf::internal::ThreadSafeArena::SpaceUsed(ThreadSafeArena *this)

{
  SerialArena *serial;
  bool bVar1;
  __pointer_type this_00;
  long lVar2;
  Span<const_std::atomic<google::protobuf::internal::SerialArena_*>_> SVar3;
  uint64_t space_used;
  uint64_t local_40;
  anon_class_8_1_bb8cb114 local_38;
  
  local_38.space_used = &local_40;
  local_40 = 0x78;
  SpaceUsed::anon_class_8_1_bb8cb114::operator()(&local_38,&this->first_arena_);
  this_00 = (this->head_)._M_b._M_p;
  while( true ) {
    bVar1 = SerialArenaChunk::IsSentry(this_00);
    if (bVar1) break;
    SerialArenaChunk::next_chunk(this_00);
    SVar3 = SerialArenaChunk::arenas(this_00);
    for (lVar2 = 0; SVar3.len_ << 3 != lVar2; lVar2 = lVar2 + 8) {
      serial = *(SerialArena **)((long)&((SVar3.ptr_)->_M_b)._M_p + lVar2);
      if (serial != (SerialArena *)0x0) {
        SpaceUsed::anon_class_8_1_bb8cb114::operator()(&local_38,serial);
      }
    }
    this_00 = SerialArenaChunk::next_chunk(this_00);
  }
  return (local_40 + (ulong)((this->alloc_policy_).policy_ < 8) * 0x20) - 0x20;
}

Assistant:

uint64_t ThreadSafeArena::SpaceUsed() const {
  // `first_arena_` doesn't have kSerialArenaSize overhead, so adjust it here.
  uint64_t space_used = kSerialArenaSize;
  VisitSerialArena([&space_used](const SerialArena* serial) {
    // SerialArena on chunks directly allocated from the block and needs to be
    // subtracted from SpaceUsed.
    space_used += serial->SpaceUsed() - kSerialArenaSize;
  });
  return space_used - (alloc_policy_.get() ? sizeof(AllocationPolicy) : 0);
}